

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::status_internal::StatusRep::ForEachPayload
          (StatusRep *this,
          FunctionRef<void_(std::basic_string_view<char,_std::char_traits<char>_>,_const_absl::lts_20250127::Cord_&)>
          visitor)

{
  InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *this_00;
  reference pVVar1;
  long lVar2;
  ulong uVar3;
  size_type i;
  ulong uVar4;
  bool bVar5;
  type tVar6;
  char *local_50;
  size_t local_48;
  
  this_00 = (this->payloads_)._M_t.
            super___uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
            .
            super__Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
            ._M_head_impl;
  if (this_00 !=
      (InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
       *)0x0) {
    uVar3 = *(ulong *)&(this_00->storage_).metadata_;
    bVar5 = uVar3 < 4;
    lVar2 = -1;
    for (uVar4 = 0; uVar4 < uVar3 >> 1; uVar4 = uVar4 + 1) {
      i = (uVar3 >> 1) + lVar2;
      if (bVar5 || (uint)((ulong)this_00 % 0xd) < 7) {
        i = uVar4;
      }
      pVVar1 = InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
               ::operator[](this_00,i);
      std::__cxx11::string::string((string *)&local_50,(string *)pVVar1);
      tVar6._M_str = local_50;
      tVar6._M_len = local_48;
      (*visitor.invoker_)(visitor.ptr_,tVar6,&pVVar1->payload);
      std::__cxx11::string::~string((string *)&local_50);
      uVar3 = *(ulong *)&(this_00->storage_).metadata_;
      lVar2 = lVar2 + -1;
    }
  }
  return;
}

Assistant:

void StatusRep::ForEachPayload(
    absl::FunctionRef<void(absl::string_view, const absl::Cord&)> visitor)
    const {
  if (auto* payloads = payloads_.get()) {
    bool in_reverse =
        payloads->size() > 1 && reinterpret_cast<uintptr_t>(payloads) % 13 > 6;

    for (size_t index = 0; index < payloads->size(); ++index) {
      const auto& elem =
          (*payloads)[in_reverse ? payloads->size() - 1 - index : index];

#ifdef NDEBUG
      visitor(elem.type_url, elem.payload);
#else
      // In debug mode invalidate the type url to prevent users from relying on
      // this string lifetime.

      // NOLINTNEXTLINE intentional extra conversion to force temporary.
      visitor(std::string(elem.type_url), elem.payload);
#endif  // NDEBUG
    }
  }
}